

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator+=(SSVectorBase<double> *this,SSVectorBase<double> *vec)

{
  int iVar1;
  int *piVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  
  piVar2 = (vec->super_IdxSet).idx;
  pdVar3 = (vec->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = (ulong)(uint)(vec->super_IdxSet).num; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    iVar1 = piVar2[uVar5 - 1];
    pdVar4[iVar1] = pdVar3[iVar1] + pdVar4[iVar1];
  }
  if (this->setupStatus != false) {
    this->setupStatus = false;
    setup(this);
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator+=(const SSVectorBase<S>& vec)
   {
      assert(vec.isSetup());

      for(int i = vec.size() - 1; i >= 0; --i)
         VectorBase<R>::val[vec.index(i)] += vec.value(i);

      if(isSetup())
      {
         setupStatus = false;
         setup();
      }

      return *this;
   }